

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<NDevice,std::allocator<NDevice>>&,std::vector<NTrodeObj,std::allocator<NTrodeObj>>&>
          (InputArchive<cereal::PortableBinaryInputArchive,_1U> *this,
          vector<NDevice,_std::allocator<NDevice>_> *head,
          vector<NTrodeObj,_std::allocator<NTrodeObj>_> *tail)

{
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_RDI;
  vector<NDevice,_std::allocator<NDevice>_> *in_stack_ffffffffffffffd8;
  
  process<std::vector<NDevice,std::allocator<NDevice>>&>(in_RDI,in_stack_ffffffffffffffd8);
  process<std::vector<NTrodeObj,std::allocator<NTrodeObj>>&>
            (in_RDI,(vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }